

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O2

void __thiscall dgSphere::dgSphere(dgSphere *this,dgMatrix *matrix,dgVector *dim)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = (matrix->m_front).super_dgTemplateVector<float>.m_y;
  fVar2 = (matrix->m_front).super_dgTemplateVector<float>.m_z;
  fVar3 = (matrix->m_front).super_dgTemplateVector<float>.m_w;
  fVar4 = (matrix->m_up).super_dgTemplateVector<float>.m_x;
  fVar5 = (matrix->m_up).super_dgTemplateVector<float>.m_y;
  fVar6 = (matrix->m_up).super_dgTemplateVector<float>.m_z;
  fVar7 = (matrix->m_up).super_dgTemplateVector<float>.m_w;
  fVar8 = (matrix->m_right).super_dgTemplateVector<float>.m_x;
  fVar9 = (matrix->m_right).super_dgTemplateVector<float>.m_y;
  fVar10 = (matrix->m_right).super_dgTemplateVector<float>.m_z;
  fVar11 = (matrix->m_right).super_dgTemplateVector<float>.m_w;
  fVar12 = (matrix->m_posit).super_dgTemplateVector<float>.m_x;
  fVar13 = (matrix->m_posit).super_dgTemplateVector<float>.m_y;
  fVar14 = (matrix->m_posit).super_dgTemplateVector<float>.m_z;
  fVar15 = (matrix->m_posit).super_dgTemplateVector<float>.m_w;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
       (matrix->m_front).super_dgTemplateVector<float>.m_x;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar1;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar2;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = fVar3;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x = fVar4;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = fVar5;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar6;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = fVar7;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x = fVar8;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar9;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = fVar10;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = fVar11;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x = fVar12;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y = fVar13;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z = fVar14;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_w = fVar15;
  SetDimensions(this,(HaF32)(dim->super_dgTemplateVector<float>).m_x,
                (HaF32)(dim->super_dgTemplateVector<float>).m_y,
                (HaF32)(dim->super_dgTemplateVector<float>).m_z);
  return;
}

Assistant:

dgSphere::dgSphere(const dgMatrix &matrix, const dgVector& dim)
	:dgMatrix(matrix)
{
   SetDimensions (dim.m_x, dim.m_y, dim.m_z);
//   HACD_ASSERT (0);
//	planeTest = FrontTest;
}